

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

char * __thiscall cplus::lang::StringSet::getStruction(StringSet *this)

{
  TreeNode *this_00;
  char *pcVar1;
  undefined1 local_c8 [8];
  CPlusString swap;
  function<void_(cplus::lang::StringSet::TreeNode_*)> local_70;
  undefined8 local_40;
  size_t id;
  StringBuilder sb;
  StringSet *this_local;
  
  sb.value = (string)0x0;
  sb._9_7_ = 0;
  sb._16_8_ = 0;
  id = 0;
  sb.super_Object._vptr_Object = (_func_int **)0x0;
  sb._24_8_ = 0;
  sb._32_8_ = this;
  utils::StringBuilder::StringBuilder((StringBuilder *)&id);
  local_40 = 0;
  utils::StringBuilder::append((StringBuilder *)&id,"[");
  this_00 = this->root;
  swap.mutex.mutex.__data.__list.__next = (__pthread_internal_list *)&id;
  std::function<void(cplus::lang::StringSet::TreeNode*)>::
  function<cplus::lang::StringSet::getStruction()const::_lambda(cplus::lang::StringSet::TreeNode*)_1_,void>
            ((function<void(cplus::lang::StringSet::TreeNode*)> *)&local_70,
             (anon_class_16_2_f9f08345 *)&swap.mutex.mutex.__data.__list.__next);
  TreeNode::forEach(this_00,&local_70);
  std::function<void_(cplus::lang::StringSet::TreeNode_*)>::~function(&local_70);
  utils::StringBuilder::append((StringBuilder *)&id,"]");
  pcVar1 = utils::StringBuilder::c_str((StringBuilder *)&id);
  CPlusString::CPlusString((CPlusString *)local_c8,pcVar1);
  struction = CPlusString::getStr((CPlusString *)local_c8);
  CPlusString::setToNull((CPlusString *)local_c8);
  pcVar1 = struction;
  CPlusString::~CPlusString((CPlusString *)local_c8);
  utils::StringBuilder::~StringBuilder((StringBuilder *)&id);
  return pcVar1;
}

Assistant:

char *getStruction() const {
				utils::StringBuilder sb = utils::StringBuilder();
				size_t id = 0;
				sb.append("[");
				root->forEach([&sb, &id](TreeNode *it) {
					if (id != 0) {
						sb.append(",");
					}
					sb.append(R"({"node":")");
					sb.append((void *) it);
					sb.append(R"(","parent":")");
					sb.append((void *) it->getParent());
					sb.append(R"(","left":")");
					sb.append((void *) it->getLeft());
					sb.append(R"(","right":")");
					sb.append((void *) it->getRight());
					sb.append(R"(","color":")");
					sb.append(it->isRed() ? "RED" : "BLACK");
					sb.append(R"(","size":")");
					sb.append((unsigned long) it->getSize());
					sb.append(R"(","leftOrRight":")");
					sb.append(it->isLeftNode() ? "LEFT" : "RIGHT");
					sb.append(R"(","value":")");
					
					auto strSize = it->get()->getSize();
					auto *buffer = new char[strSize * 2];
					escapeString(buffer, it->get()->getStr(), strSize);
					sb.append(buffer);
					delete[] buffer;
					
					sb.append("\"}");
					++id;
				});
				sb.append("]");
				auto swap = CPlusString(sb.c_str());
				struction = swap.getStr();
				swap.setToNull();
				return struction;
			}